

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

S2PointLoopSpan __thiscall
S2::PruneDegeneracies
          (S2 *this,S2PointLoopSpan loop,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *new_vertices)

{
  S2 *pSVar1;
  double dVar2;
  double dVar3;
  iterator __position;
  VType VVar4;
  uint uVar5;
  long lVar6;
  pointer pVVar7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *this_00;
  int iVar11;
  uint uVar12;
  long lVar13;
  iterator __begin1;
  bool bVar14;
  S2PointLoopSpan SVar15;
  
  this_00 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)loop.super_S2PointSpan.len_;
  pVVar7 = loop.super_S2PointSpan.ptr_;
  if (*(long *)(this_00 + 8) != *(long *)this_00) {
    *(long *)(this_00 + 8) = *(long *)this_00;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this_00,(size_type)pVVar7
            );
  if (pVVar7 != (pointer)0x0) {
    pSVar1 = this + (long)pVVar7 * 0x18;
    do {
      __position._M_current = *(Vector3<double> **)(this_00 + 8);
      if (*(Vector3<double> **)this_00 == __position._M_current) {
LAB_001ff38f:
        if (1 < (ulong)(((long)__position._M_current - (long)*(Vector3<double> **)this_00 >> 3) *
                       -0x5555555555555555)) {
          lVar6 = 0;
          do {
            dVar2 = *(double *)(this + lVar6);
            dVar3 = *(double *)((long)__position._M_current[-2].c_ + lVar6);
            if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
            bVar14 = lVar6 != 0x10;
            lVar6 = lVar6 + 8;
          } while (bVar14);
          if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
            *(Vector3<double> **)(this_00 + 8) = __position._M_current + -1;
            goto LAB_001ff401;
          }
        }
        if (__position._M_current == *(Vector3<double> **)(this_00 + 0x10)) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>(this_00,__position,(Vector3<double> *)this);
        }
        else {
          (__position._M_current)->c_[2] = *(VType *)(this + 0x10);
          VVar4 = *(VType *)(this + 8);
          (__position._M_current)->c_[0] = *(VType *)this;
          (__position._M_current)->c_[1] = VVar4;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
        }
      }
      else {
        lVar6 = 0;
        do {
          dVar2 = *(double *)(this + lVar6);
          dVar3 = *(double *)((long)__position._M_current[-1].c_ + lVar6);
          if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
          bVar14 = lVar6 != 0x10;
          lVar6 = lVar6 + 8;
        } while (bVar14);
        if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) goto LAB_001ff38f;
      }
LAB_001ff401:
      this = this + 0x18;
    } while (this != pSVar1);
  }
  lVar6 = *(long *)this_00;
  lVar9 = *(long *)(this_00 + 8);
  sVar10 = 0;
  pVVar7 = (pointer)0x0;
  if (2 < (ulong)((lVar9 - lVar6 >> 3) * -0x5555555555555555)) {
    lVar8 = 0;
    do {
      dVar2 = *(double *)(lVar6 + lVar8);
      dVar3 = *(double *)(lVar9 + -0x18 + lVar8);
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
      bVar14 = lVar8 != 0x10;
      lVar8 = lVar8 + 8;
    } while (bVar14);
    if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
      *(long *)(this_00 + 8) = lVar9 + -0x18;
      lVar9 = lVar9 + -0x18;
    }
    iVar11 = -1;
    lVar8 = lVar6;
    uVar5 = 0;
    do {
      uVar12 = uVar5;
      lVar8 = lVar8 + 0x18;
      lVar13 = 0;
      do {
        dVar2 = *(double *)(lVar8 + lVar13);
        dVar3 = *(double *)(lVar9 + (long)iVar11 * 0x18 + lVar13);
        if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) break;
        bVar14 = lVar13 != 0x10;
        lVar13 = lVar13 + 8;
      } while (bVar14);
      iVar11 = iVar11 + -1;
    } while ((dVar2 == dVar3) && (uVar5 = uVar12 + 1, !NAN(dVar2) && !NAN(dVar3)));
    pVVar7 = (pointer)(lVar6 + (ulong)uVar12 * 0x18);
    sVar10 = (lVar9 - lVar6 >> 3) * -0x5555555555555555 - (ulong)(uVar12 * 2);
  }
  SVar15.super_S2PointSpan.len_ = sVar10;
  SVar15.super_S2PointSpan.ptr_ = pVVar7;
  return (S2PointLoopSpan)SVar15.super_S2PointSpan;
}

Assistant:

S2PointLoopSpan PruneDegeneracies(S2PointLoopSpan loop,
                                  vector<S2Point>* new_vertices) {
  vector<S2Point>& vertices = *new_vertices;
  vertices.clear();
  vertices.reserve(loop.size());
  for (const S2Point& v : loop) {
    // Remove duplicate vertices.
    if (vertices.empty() || v != vertices.back()) {
      // Remove edge pairs of the form ABA.
      if (vertices.size() >= 2 && v == vertices.end()[-2]) {
        vertices.pop_back();
      } else {
        vertices.push_back(v);
      }
    }
  }
  // Check whether the loop was completely degenerate.
  if (vertices.size() < 3) return S2PointLoopSpan();

  // Otherwise some portion of the loop is guaranteed to be non-degenerate.
  // However there may still be some degenerate portions to remove.
  if (vertices[0] == vertices.back()) vertices.pop_back();

  // If the loop begins with BA and ends with A, then there is an edge pair of
  // the form ABA at the end/start of the loop.  Remove all such pairs.  As
  // noted above, this is guaranteed to leave a non-degenerate loop.
  int k = 0;
  while (vertices[k + 1] == vertices.end()[-(k + 1)]) ++k;
  return S2PointLoopSpan(vertices.data() + k, vertices.size() - 2 * k);
}